

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

UA_Guid UA_Guid_random(void)

{
  byte bVar1;
  uint uVar2;
  byte bVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  UA_Guid UVar8;
  
  uVar2 = (uint)(UA_rng_0 >> 0x2d) ^ (uint)(UA_rng_0 >> 0x1b);
  bVar3 = (byte)(UA_rng_0 >> 0x3b);
  uVar4 = UA_rng_0 * 0x5851f42d4c957f2d + UA_rng_1;
  uVar5 = (uint)(uVar4 >> 0x2d) ^ (uint)(uVar4 >> 0x1b);
  bVar1 = (byte)(uVar4 >> 0x3b);
  uVar6 = uVar5 >> bVar1 | uVar5 << 0x20 - bVar1;
  uVar4 = uVar4 * 0x5851f42d4c957f2d + UA_rng_1;
  uVar5 = (uint)(uVar4 >> 0x2d) ^ (uint)(uVar4 >> 0x1b);
  bVar1 = (byte)(uVar4 >> 0x3b);
  uVar7 = uVar5 >> bVar1 | uVar5 << 0x20 - bVar1;
  uVar4 = uVar4 * 0x5851f42d4c957f2d + UA_rng_1;
  UA_rng_0 = uVar4 * 0x5851f42d4c957f2d + UA_rng_1;
  uVar5 = (uint)(uVar4 >> 0x2d) ^ (uint)(uVar4 >> 0x1b);
  bVar1 = (byte)(uVar4 >> 0x3b);
  uVar5 = uVar5 >> bVar1 | uVar5 << 0x20 - bVar1;
  UVar8._0_8_ = (ulong)(uVar2 >> bVar3 | uVar2 << 0x20 - bVar3) |
                (ulong)(uVar6 & 0xffff) << 0x20 | (ulong)(uVar6 >> 0x10) << 0x30;
  UVar8.data4 = (UA_Byte  [8])
                ((ulong)((uVar7 & 0xff0) << 4) |
                 (ulong)((uVar7 & 0xff00) << 8) |
                 (ulong)((uVar7 & 0xff000) << 0xc) |
                 (ulong)(uVar5 & 0xff) << 0x20 |
                 (ulong)(uVar5 >> 4 & 0xff) << 0x28 |
                 (ulong)(uVar5 >> 8 & 0xff) << 0x30 | (ulong)(uVar5 >> 0xc) << 0x38 |
                (ulong)(uVar7 & 0xff));
  return UVar8;
}

Assistant:

UA_Guid
UA_Guid_random(void) {
    UA_Guid result;
    result.data1 = (UA_UInt32)pcg32_random_r(&UA_rng);
    UA_UInt32 r = (UA_UInt32)pcg32_random_r(&UA_rng);
    result.data2 = (UA_UInt16) r;
    result.data3 = (UA_UInt16) (r >> 16);
    r = (UA_UInt32)pcg32_random_r(&UA_rng);
    result.data4[0] = (UA_Byte)r;
    result.data4[1] = (UA_Byte)(r >> 4);
    result.data4[2] = (UA_Byte)(r >> 8);
    result.data4[3] = (UA_Byte)(r >> 12);
    r = (UA_UInt32)pcg32_random_r(&UA_rng);
    result.data4[4] = (UA_Byte)r;
    result.data4[5] = (UA_Byte)(r >> 4);
    result.data4[6] = (UA_Byte)(r >> 8);
    result.data4[7] = (UA_Byte)(r >> 12);
    return result;
}